

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::RemoveField
          (DuckTableEntry *this,ClientContext *context,RemoveFieldInfo *info)

{
  AlterInfo *this_00;
  idx_t *this_01;
  string *psVar1;
  pointer pcVar2;
  ClientContext *context_00;
  bool bVar3;
  reference pvVar4;
  ColumnDefinition *this_02;
  LogicalType *type;
  tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> tVar5;
  ConstantExpression *pCVar6;
  CatalogException *this_03;
  AlterInfo *in_RCX;
  pointer *__ptr;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  ChangeColumnTypeInfo change_column_type;
  DroppedFieldMapping res;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_328;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_320;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_318;
  Value local_300;
  __uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_> local_2c0;
  ClientContext *local_2b8;
  LogicalType local_2b0;
  LogicalType local_298;
  string local_280;
  LogicalType local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ChangeColumnTypeInfo local_228;
  undefined1 local_170 [216];
  AlterEntryData local_98;
  
  this_00 = in_RCX + 1;
  pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)this_00,0);
  this_01 = &(context->config).asof_loop_join_threshold;
  bVar3 = ColumnList::ColumnExists((ColumnList *)this_01,pvVar4);
  if (bVar3) {
    local_2b8 = context;
    pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)this_00,0);
    this_02 = ColumnList::GetColumn((ColumnList *)this_01,pvVar4);
    type = ColumnDefinition::Type(this_02);
    DropFieldFromStruct((DroppedFieldMapping *)local_170,type,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)this_00,1);
    if (local_170[0x58] == true) {
      if ((char)in_RCX[1].catalog._M_string_length == '\0') {
        local_228.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
             (_func_int **)&local_228.super_AlterTableInfo.super_AlterInfo.catalog;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,anon_var_dwarf_63f17de + 9);
        ErrorData::Throw((ErrorData *)(local_170 + 0x58),(string *)&local_228);
      }
      (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
      _vptr_CatalogEntry = (_func_int **)0x0;
    }
    else {
      local_318.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_318.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_318.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2c0._M_t.
      super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
      super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
           (tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
           (tuple<duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)this;
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)this_00,0);
      tVar5.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )operator_new(0x50);
      psVar1 = &local_228.super_AlterTableInfo.super_AlterInfo.catalog;
      pcVar2 = (pvVar4->_M_dataplus)._M_p;
      local_228.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
           (_func_int **)psVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,pcVar2,pcVar2 + pvVar4->_M_string_length);
      ColumnRefExpression::ColumnRefExpression
                ((ColumnRefExpression *)
                 tVar5.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
                 (string *)&local_228);
      if ((string *)local_228.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo
          != psVar1) {
        operator_delete(local_228.super_AlterTableInfo.super_AlterInfo.super_ParseInfo.
                        _vptr_ParseInfo);
      }
      local_300.type_._0_8_ =
           tVar5.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_318,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_300);
      this = (DuckTableEntry *)
             local_2c0._M_t.
             super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
             .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
      if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           )local_300.type_._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_300.type_._0_8_ + 8))();
      }
      LogicalType::LogicalType(&local_298,(LogicalType *)(local_170 + 0x40));
      Value::Value(&local_300,&local_298);
      pCVar6 = (ConstantExpression *)operator_new(0x78);
      Value::Value((Value *)&local_228,&local_300);
      ConstantExpression::ConstantExpression(pCVar6,(Value *)&local_228);
      Value::~Value((Value *)&local_228);
      local_328._M_head_impl = (ParsedExpression *)pCVar6;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_318,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_328);
      if ((ConstantExpression *)local_328._M_head_impl != (ConstantExpression *)0x0) {
        (*((BaseExpression *)&((local_328._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
          ->_vptr_BaseExpression[1])();
      }
      local_328._M_head_impl = (ParsedExpression *)0x0;
      Value::~Value(&local_300);
      LogicalType::~LogicalType(&local_298);
      tVar5.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            )operator_new(0x78);
      Value::Value((Value *)&local_228,(Value *)local_170);
      ConstantExpression::ConstantExpression
                ((ConstantExpression *)
                 tVar5.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
                 (Value *)&local_228);
      Value::~Value((Value *)&local_228);
      local_300.type_._0_8_ =
           tVar5.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_318,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_300);
      if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           )local_300.type_._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_300.type_._0_8_ + 8))();
      }
      LogicalType::LogicalType(&local_2b0,SQLNULL);
      Value::Value(&local_300,&local_2b0);
      pCVar6 = (ConstantExpression *)operator_new(0x78);
      Value::Value((Value *)&local_228,&local_300);
      ConstantExpression::ConstantExpression(pCVar6,(Value *)&local_228);
      Value::~Value((Value *)&local_228);
      local_328._M_head_impl = (ParsedExpression *)pCVar6;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_318,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_328);
      if ((ConstantExpression *)local_328._M_head_impl != (ConstantExpression *)0x0) {
        (*((BaseExpression *)&((local_328._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
          ->_vptr_BaseExpression[1])();
      }
      local_328._M_head_impl = (ParsedExpression *)0x0;
      Value::~Value(&local_300);
      LogicalType::~LogicalType(&local_2b0);
      make_uniq<duckdb::FunctionExpression,char_const(&)[13],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                ((duckdb *)&local_300,(char (*) [13])"remap_struct",
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)&local_318);
      AlterInfo::GetAlterEntryData(&local_98,in_RCX);
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)this_00,0);
      pcVar2 = (pvVar4->_M_dataplus)._M_p;
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,pcVar2,pcVar2 + pvVar4->_M_string_length);
      LogicalType::LogicalType(&local_260,(LogicalType *)(local_170 + 0x40));
      local_320._M_head_impl = (ParsedExpression *)local_300.type_._0_8_;
      local_300.type_._0_8_ =
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      ChangeColumnTypeInfo::ChangeColumnTypeInfo
                (&local_228,&local_98,&local_280,&local_260,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_320);
      context_00 = local_2b8;
      if ((ConstantExpression *)local_320._M_head_impl != (ConstantExpression *)0x0) {
        (*((BaseExpression *)&((local_320._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
          ->_vptr_BaseExpression[1])();
      }
      local_320._M_head_impl = (ParsedExpression *)0x0;
      LogicalType::~LogicalType(&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.name._M_dataplus._M_p != &local_98.name.field_2) {
        operator_delete(local_98.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.schema._M_dataplus._M_p != &local_98.schema.field_2) {
        operator_delete(local_98.schema._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.catalog._M_dataplus._M_p != &local_98.catalog.field_2) {
        operator_delete(local_98.catalog._M_dataplus._M_p);
      }
      ChangeColumnType(this,context_00,(ChangeColumnTypeInfo *)info);
      ChangeColumnTypeInfo::~ChangeColumnTypeInfo(&local_228);
      if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           )local_300.type_._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_300.type_._0_8_ + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&local_318);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_170 + 0xa0));
    if ((undefined1 *)local_170._128_8_ != local_170 + 0x90) {
      operator_delete((void *)local_170._128_8_);
    }
    if ((undefined1 *)local_170._96_8_ != local_170 + 0x70) {
      operator_delete((void *)local_170._96_8_);
    }
    LogicalType::~LogicalType((LogicalType *)(local_170 + 0x40));
    Value::~Value((Value *)local_170);
  }
  else {
    if ((char)in_RCX[1].catalog._M_string_length == '\0') {
      this_03 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_170._0_8_ = local_170 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_170,"Cannot drop field from column \"%s\" - it does not exist","");
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)this_00,0);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      pcVar2 = (pvVar4->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar2,pcVar2 + pvVar4->_M_string_length);
      CatalogException::CatalogException<std::__cxx11::string>
                (this_03,(string *)local_170,&local_248);
      __cxa_throw(this_03,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
    _vptr_CatalogEntry = (_func_int **)0x0;
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (_Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::RemoveField(ClientContext &context, RemoveFieldInfo &info) {
	if (!ColumnExists(info.column_path[0])) {
		if (!info.if_column_exists) {
			throw CatalogException("Cannot drop field from column \"%s\" - it does not exist", info.column_path[0]);
		}
		return nullptr;
	}
	// follow the path
	auto &col = GetColumn(info.column_path[0]);
	auto res = DropFieldFromStruct(col.Type(), info.column_path, 1);
	if (res.error.HasError()) {
		if (!info.if_column_exists) {
			res.error.Throw();
		}
		return nullptr;
	}

	// construct the struct remapping expression
	vector<unique_ptr<ParsedExpression>> children;
	children.push_back(make_uniq<ColumnRefExpression>(info.column_path[0]));
	children.push_back(make_uniq<ConstantExpression>(Value(res.new_type)));
	children.push_back(make_uniq<ConstantExpression>(std::move(res.mapping)));
	children.push_back(make_uniq<ConstantExpression>(Value()));

	auto function = make_uniq<FunctionExpression>("remap_struct", std::move(children));

	ChangeColumnTypeInfo change_column_type(info.GetAlterEntryData(), info.column_path[0], std::move(res.new_type),
	                                        std::move(function));
	return ChangeColumnType(context, change_column_type);
}